

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

void * declare_new(t_symbol *s,int argc,t_atom *argv)

{
  t_pd *pp_Var1;
  _glist *p_Var2;
  t_declare *x;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  
  pp_Var1 = pd_new(declare_class);
  *(undefined4 *)(pp_Var1 + 7) = 1;
  p_Var2 = canvas_getcurrent();
  pp_Var1[6] = (t_pd)p_Var2;
  if ((*(ushort *)&pp_Var1[6][1].c_floatmethod >> 3 & 1) == 0) {
    canvas_declare((_glist *)pp_Var1[6],s,argc,argv);
  }
  return pp_Var1;
}

Assistant:

static void *declare_new(t_symbol *s, int argc, t_atom *argv)
{
    t_declare *x = (t_declare *)pd_new(declare_class);
    x->x_useme = 1;
    x->x_canvas = canvas_getcurrent();
        /* LATER update environment and/or load libraries */
    if (!x->x_canvas->gl_loading)
    {
        /* the object is created by the user (not by loading a patch),
         * so update canvas's properties on the fly */
        canvas_declare(x->x_canvas, s, argc, argv);
    }
    return (x);
}